

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

void amrex::UtilRenameDirectoryToOld(string *path,bool callbarrier)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  ostream *os_;
  string newoldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  Print local_1a0;
  
  if (*(int *)(DAT_006e0650 + -0x3c) == *(int *)(DAT_006e0650 + -0x30)) {
    bVar2 = FileSystem::Exists(path);
    if (bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0
                     ,path,".old.");
      UniqueString_abi_cxx11_();
      std::operator+(&local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0
                     ,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1a0);
      iVar3 = Verbose();
      if (1 < iVar3) {
        os_ = OutStream();
        Print::Print(&local_1a0,os_);
        poVar1 = &local_1a0.ss;
        std::operator<<((ostream *)poVar1,"amrex::UtilRenameDirectoryToOld():  ");
        std::operator<<((ostream *)poVar1,(string *)path);
        std::operator<<((ostream *)poVar1," exists.  Renaming to:  ");
        std::operator<<((ostream *)poVar1,(string *)&local_1e0);
        std::endl<char,std::char_traits<char>>((ostream *)poVar1);
        Print::~Print(&local_1a0);
      }
      rename((path->_M_dataplus)._M_p,local_1e0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
  }
  if (callbarrier) {
    std::__cxx11::string::string
              ((string *)&local_1a0,"amrex::UtilRenameDirectoryToOld",(allocator *)&local_1e0);
    ParallelDescriptor::Barrier((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  return;
}

Assistant:

void
amrex::UtilRenameDirectoryToOld (const std::string &path, bool callbarrier)
{
  if(ParallelContext::IOProcessorSub()) {
    if(amrex::FileExists(path)) {
      std::string newoldname(path + ".old." + amrex::UniqueString());
      if (amrex::Verbose() > 1) {
          amrex::Print() << "amrex::UtilRenameDirectoryToOld():  " << path
                         << " exists.  Renaming to:  " << newoldname << std::endl;
      }
      std::rename(path.c_str(), newoldname.c_str());
    }
  }
  if(callbarrier) {
    // Force other processors to wait until directory is renamed.
    ParallelDescriptor::Barrier("amrex::UtilRenameDirectoryToOld");
  }
}